

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureTestUtil.cpp
# Opt level: O1

int glu::TextureTestUtil::computeTextureLookupDiff
              (ConstPixelBufferAccess *result,ConstPixelBufferAccess *reference,
              PixelBufferAccess *errorMask,Texture1DView *baseView,float *texCoord,
              ReferenceParams *sampleParams,LookupPrecision *lookupPrec,LodPrecision *lodPrec,
              qpWatchDog *watchDog)

{
  ulong uVar1;
  bool bVar2;
  int i;
  int iVar3;
  long lVar4;
  ulong uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int lodOffsNdx;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  float fVar15;
  float fVar16;
  float fVar17;
  float fVar18;
  float fVar19;
  float fVar20;
  float fVar21;
  Texture1DView TVar22;
  Vec2 lodO;
  Vec2 lodBounds;
  Vec2 clampedLod;
  Vec4 refPix;
  Vec4 resPix;
  Vec3 triW [2];
  Vec3 triS [2];
  Vec2 lodBias;
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> srcLevelStorage;
  Texture1DView src;
  Vec2 lodOffsets [4];
  int local_1dc;
  float local_1d4;
  undefined1 local_1c8 [36];
  float local_1a4;
  float local_1a0;
  float local_19c;
  undefined1 local_198 [32];
  undefined4 local_178;
  float local_170;
  float local_16c;
  float local_168;
  float local_164;
  float local_160;
  float local_15c;
  float local_158;
  float local_154;
  float local_150;
  float local_14c;
  float local_148;
  float local_144;
  Vec2 local_140;
  float local_138 [4];
  Vec4 local_128;
  float local_118 [8];
  float local_f8 [6];
  PixelBufferAccess *local_e0;
  undefined1 local_d8 [16];
  Sampler *local_c8;
  ConstPixelBufferAccess *local_c0;
  ConstPixelBufferAccess *local_b8;
  float afStack_b0 [2];
  vector<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_> local_a8;
  Texture1DView local_88;
  undefined1 local_78 [4];
  float fStack_74;
  ConstPixelBufferAccess *pCStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined1 local_58 [16];
  undefined1 local_48 [16];
  
  local_a8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_a8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_a8.
  super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  iVar8 = sampleParams->baseLevel;
  iVar6 = baseView->m_numLevels + -1;
  iVar3 = iVar6;
  if (iVar8 < iVar6) {
    iVar3 = iVar8;
  }
  iVar7 = 0;
  if (-1 < iVar8) {
    iVar7 = iVar3;
  }
  iVar8 = sampleParams->maxLevel;
  if (iVar8 < iVar6) {
    iVar6 = iVar8;
  }
  iVar3 = 1;
  if (iVar7 <= iVar8) {
    iVar3 = (iVar6 - iVar7) + 1;
  }
  pCStack_70 = baseView->m_levels + iVar7;
  local_78 = (undefined1  [4])iVar3;
  local_c8 = &sampleParams->sampler;
  local_e0 = errorMask;
  local_b8 = reference;
  TVar22 = tcu::getEffectiveTextureView((Texture1DView *)local_78,&local_a8,local_c8);
  local_88.m_levels = TVar22.m_levels;
  local_88.m_numLevels = TVar22.m_numLevels;
  local_f8[0] = *texCoord;
  local_f8[1] = texCoord[1];
  local_f8[2] = texCoord[2];
  local_f8[3] = texCoord[3];
  fVar10 = 0.0;
  local_1d4 = 0.0;
  if (0 < local_88.m_numLevels) {
    local_1d4 = (float)((local_88.m_levels)->m_size).m_data[0];
  }
  fVar19 = (float)(result->m_size).m_data[0];
  fVar20 = (float)(result->m_size).m_data[1];
  local_118[0] = (sampleParams->super_RenderParams).w.m_data[0];
  local_118[1] = (sampleParams->super_RenderParams).w.m_data[1];
  local_118[2] = (sampleParams->super_RenderParams).w.m_data[2];
  local_118[3] = (sampleParams->super_RenderParams).w.m_data[3];
  if (((sampleParams->super_RenderParams).flags & 2) != 0) {
    fVar10 = (sampleParams->super_RenderParams).bias;
  }
  lVar4 = 0;
  do {
    afStack_b0[lVar4] = fVar10;
    lVar4 = lVar4 + 1;
  } while (lVar4 == 1);
  local_78 = (undefined1  [4])0xbf800000;
  fStack_74 = 0.0;
  pCStack_70 = (ConstPixelBufferAccess *)0x3f800000;
  local_68 = 0xbf80000000000000;
  uStack_60 = 0x3f80000000000000;
  local_138[0] = -1.7146522e+38;
  local_118[4] = local_118[2];
  local_118[5] = local_118[1];
  local_f8[4] = local_f8[2];
  local_f8[5] = local_f8[1];
  tcu::RGBA::toVec((RGBA *)&local_128);
  tcu::clear(local_e0,&local_128);
  if ((result->m_size).m_data[1] < 1) {
    local_198._24_8_ = 0;
  }
  else {
    local_198._24_8_ = 0;
    local_1dc = 0;
    local_c0 = result;
    do {
      if (watchDog != (qpWatchDog *)0x0) {
        qpWatchDog_touch(watchDog);
      }
      if (0 < (result->m_size).m_data[0]) {
        local_1c8._24_4_ = (float)local_1dc + 0.5;
        local_1c8._20_4_ = (float)local_1c8._24_4_ / fVar20;
        local_16c = fVar20 - (float)local_1c8._24_4_;
        local_170 = 1.0 - (float)local_1c8._20_4_;
        iVar8 = 0;
        do {
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_1c8,(int)result,iVar8,local_1dc);
          local_138[0] = 0.0;
          local_138[1] = 0.0;
          local_138[2] = 0.0;
          local_138[3] = 0.0;
          lVar4 = 0;
          do {
            local_138[lVar4] =
                 *(float *)(local_1c8 + lVar4 * 4) -
                 (sampleParams->super_RenderParams).colorBias.m_data[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_128.m_data[0] = 0.0;
          local_128.m_data[1] = 0.0;
          local_128.m_data[2] = 0.0;
          local_128.m_data[3] = 0.0;
          lVar4 = 0;
          do {
            local_128.m_data[lVar4] =
                 local_138[lVar4] / (sampleParams->super_RenderParams).colorScale.m_data[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          tcu::ConstPixelBufferAccess::getPixel
                    ((ConstPixelBufferAccess *)local_198,(int)local_b8,iVar8,local_1dc);
          local_1c8._0_4_ = R;
          local_1c8._4_4_ = SNORM_INT8;
          local_1c8._8_4_ = 0;
          local_1c8._12_4_ = 0;
          lVar4 = 0;
          do {
            *(float *)(local_1c8 + lVar4 * 4) =
                 *(float *)(local_198 + lVar4 * 4) -
                 (sampleParams->super_RenderParams).colorBias.m_data[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_138[0] = 0.0;
          local_138[1] = 0.0;
          local_138[2] = 0.0;
          local_138[3] = 0.0;
          lVar4 = 0;
          do {
            local_138[lVar4] =
                 *(float *)(local_1c8 + lVar4 * 4) /
                 (sampleParams->super_RenderParams).colorScale.m_data[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_198._0_4_ = R;
          local_198._4_4_ = SNORM_INT8;
          local_198._8_4_ = 0;
          local_198._12_4_ = 0;
          lVar4 = 0;
          do {
            *(float *)(local_198 + lVar4 * 4) = local_128.m_data[lVar4] - local_138[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_1c8._0_4_ = R;
          local_1c8._4_4_ = SNORM_INT8;
          local_1c8._8_4_ = 0;
          local_1c8._12_4_ = 0;
          lVar4 = 0;
          do {
            fVar10 = *(float *)(local_198 + lVar4 * 4);
            fVar9 = -fVar10;
            if (-fVar10 <= fVar10) {
              fVar9 = fVar10;
            }
            *(float *)(local_1c8 + lVar4 * 4) = fVar9;
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          local_178 = 0;
          lVar4 = 0;
          do {
            *(bool *)((long)&local_178 + lVar4) =
                 *(float *)(local_1c8 + lVar4 * 4) <= (lookupPrec->colorThreshold).m_data[lVar4];
            lVar4 = lVar4 + 1;
          } while (lVar4 != 4);
          if (local_178._0_1_ == (tcu)0x0) {
LAB_01906167:
            fVar10 = (float)iVar8 + 0.5;
            local_168 = fVar10 / fVar19;
            bVar2 = 1.0 <= (float)local_1c8._20_4_ + local_168;
            local_160 = (float)local_1c8._20_4_;
            local_1a4 = fVar10;
            local_1c8._32_4_ = local_1c8._24_4_;
            if (bVar2) {
              local_168 = 1.0 - local_168;
              local_160 = local_170;
              local_1a4 = fVar19 - fVar10;
              local_1c8._32_4_ = local_16c;
            }
            uVar1 = (ulong)bVar2;
            local_1c8._28_4_ = local_f8[uVar1 * 3];
            local_164 = local_f8[uVar1 * 3 + 1];
            fVar9 = local_118[uVar1 * 3];
            local_19c = local_118[uVar1 * 3 + 1];
            fVar11 = local_f8[uVar1 * 3 + 2];
            local_1a0 = local_118[uVar1 * 3 + 2];
            local_144 = local_19c * local_1a0;
            local_148 = local_1a0 * fVar19;
            fVar10 = (fVar19 * (local_160 + -1.0) + fVar10) * local_144 -
                     (local_148 * local_160 + fVar10 * local_19c) * fVar9;
            fVar21 = fVar9 * local_19c * local_1a0;
            fVar15 = fVar21 * fVar19;
            local_14c = ((float)local_1c8._28_4_ - fVar11) * local_19c;
            local_150 = (local_164 - (float)local_1c8._28_4_) * local_1a0 +
                        (fVar11 - local_164) * fVar9;
            local_58 = ZEXT416((uint)fVar15);
            local_154 = local_19c * fVar20;
            fVar13 = (fVar20 * (local_168 + -1.0) + (float)local_1c8._24_4_) * local_144 -
                     (local_154 * local_168 + (float)local_1c8._24_4_ * local_1a0) * fVar9;
            local_d8 = ZEXT416((uint)fVar9);
            local_158 = (local_164 - fVar11) * fVar9 +
                        (fVar11 - (float)local_1c8._28_4_) * local_19c;
            local_15c = ((float)local_1c8._28_4_ - local_164) * local_1a0;
            fVar21 = fVar21 * fVar20;
            local_48 = ZEXT416((uint)fVar21);
            tcu::computeLodBoundsFromDerivates
                      ((tcu *)local_198,
                       ((((local_160 + -1.0) * local_14c + local_160 * local_150) * fVar15) /
                       (fVar10 * fVar10)) * local_1d4,
                       ((((local_168 + -1.0) * local_15c + local_168 * local_158) * fVar21) /
                       (fVar13 * fVar13)) * local_1d4,lodPrec);
            fVar9 = (1.0 - local_168) - local_160;
            fVar13 = ((float)local_1c8._28_4_ * fVar9) / (float)local_d8._0_4_;
            fVar21 = (local_164 * local_160) / local_19c;
            fVar15 = (fVar11 * local_168) / local_1a0;
            fVar9 = fVar9 / (float)local_d8._0_4_;
            fVar11 = local_160 / local_19c;
            fVar17 = local_168 / local_1a0;
            fVar10 = -(float)local_d8._0_4_;
            lVar4 = 0;
            local_d8._0_8_ = local_d8._0_8_ ^ 0x8000000080000000;
            local_d8._8_4_ = local_d8._8_4_ ^ 0x80000000;
            local_d8._12_4_ = local_d8._12_4_ ^ 0x80000000;
            do {
              fVar12 = *(float *)(local_78 + lVar4 * 8) + local_1a4;
              fVar16 = *(float *)(local_78 + lVar4 * 8 + 4) + (float)local_1c8._32_4_;
              fVar18 = fVar16 / fVar20;
              fVar14 = fVar12 / fVar19;
              fVar12 = (fVar19 * (fVar18 + -1.0) + fVar12) * local_144 +
                       (local_148 * fVar18 + fVar12 * local_19c) * fVar10;
              fVar10 = (fVar20 * (fVar14 + -1.0) + fVar16) * local_144 +
                       (local_154 * fVar14 + fVar16 * local_1a0) * fVar10;
              tcu::computeLodBoundsFromDerivates
                        ((tcu *)local_1c8,
                         ((((fVar18 + -1.0) * local_14c + fVar18 * local_150) *
                          (float)local_58._0_4_) / (fVar12 * fVar12)) * local_1d4,
                         ((((fVar14 + -1.0) * local_15c + fVar14 * local_158) *
                          (float)local_48._0_4_) / (fVar10 * fVar10)) * local_1d4,lodPrec);
              local_198._4_4_ =
                   ~-(uint)((float)local_1c8._4_4_ <= (float)local_198._4_4_) & local_1c8._4_4_ |
                   local_198._4_4_ & -(uint)((float)local_1c8._4_4_ <= (float)local_198._4_4_);
              local_198._0_4_ =
                   ~-(uint)((float)local_198._0_4_ <= (float)local_1c8._0_4_) & local_1c8._0_4_ |
                   local_198._0_4_ & -(uint)((float)local_198._0_4_ <= (float)local_1c8._0_4_);
              lVar4 = lVar4 + 1;
              fVar10 = (float)local_d8._0_4_;
            } while (lVar4 != 4);
            local_1c8._0_4_ = R;
            local_1c8._4_4_ = SNORM_INT8;
            lVar4 = 0;
            do {
              *(float *)(local_1c8 + lVar4 * 4) =
                   *(float *)(local_198 + lVar4 * 4) + afStack_b0[lVar4];
              lVar4 = lVar4 + 1;
            } while (lVar4 == 1);
            local_140.m_data[0] = sampleParams->minLod;
            local_140.m_data[1] = sampleParams->maxLod;
            tcu::clampLodBounds((tcu *)&local_178,(Vec2 *)local_1c8,&local_140,lodPrec);
            bVar2 = tcu::isLookupResultValid
                              (&local_88,local_c8,lookupPrec,
                               (fVar15 + fVar21 + fVar13) / (fVar17 + fVar11 + fVar9),
                               (Vec2 *)&local_178,&local_128);
            if (!bVar2) {
              local_140.m_data[0] = -1.7014636e+38;
              tcu::RGBA::toVec((RGBA *)local_1c8);
              tcu::PixelBufferAccess::setPixel(local_e0,(Vec4 *)local_1c8,iVar8,local_1dc,0);
              local_198._24_8_ = ZEXT48((int)local_198._24_8_ + 1);
            }
          }
          else {
            uVar1 = 0;
            do {
              uVar5 = uVar1;
              if (uVar5 == 3) break;
              uVar1 = uVar5 + 1;
            } while (*(char *)((long)&local_178 + uVar5 + 1) != '\0');
            if (uVar5 < 3) goto LAB_01906167;
          }
          iVar8 = iVar8 + 1;
          result = local_c0;
        } while (iVar8 < (local_c0->m_size).m_data[0]);
      }
      local_1dc = local_1dc + 1;
    } while (local_1dc < (result->m_size).m_data[1]);
  }
  if (local_a8.
      super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.
                    super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.
                          super__Vector_base<tcu::ConstPixelBufferAccess,_std::allocator<tcu::ConstPixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  return (int)local_198._24_8_;
}

Assistant:

int computeTextureLookupDiff (const tcu::ConstPixelBufferAccess&	result,
							  const tcu::ConstPixelBufferAccess&	reference,
							  const tcu::PixelBufferAccess&			errorMask,
							  const tcu::Texture1DView&				baseView,
							  const float*							texCoord,
							  const ReferenceParams&				sampleParams,
							  const tcu::LookupPrecision&			lookupPrec,
							  const tcu::LodPrecision&				lodPrec,
							  qpWatchDog*							watchDog)
{
	DE_ASSERT(result.getWidth() == reference.getWidth() && result.getHeight() == reference.getHeight());
	DE_ASSERT(result.getWidth() == errorMask.getWidth() && result.getHeight() == errorMask.getHeight());

	std::vector<tcu::ConstPixelBufferAccess>	srcLevelStorage;
	const tcu::Texture1DView					src					= getEffectiveTextureView(getSubView(baseView, sampleParams.baseLevel, sampleParams.maxLevel), srcLevelStorage, sampleParams.sampler);

	const tcu::Vec4								sq					= tcu::Vec4(texCoord[0], texCoord[1], texCoord[2], texCoord[3]);

	const tcu::IVec2							dstSize				= tcu::IVec2(result.getWidth(), result.getHeight());
	const float									dstW				= float(dstSize.x());
	const float									dstH				= float(dstSize.y());
	const int									srcSize				= src.getWidth();

	// Coordinates and lod per triangle.
	const tcu::Vec3								triS[2]				= { sq.swizzle(0, 1, 2), sq.swizzle(3, 2, 1) };
	const tcu::Vec3								triW[2]				= { sampleParams.w.swizzle(0, 1, 2), sampleParams.w.swizzle(3, 2, 1) };

	const tcu::Vec2								lodBias				((sampleParams.flags & ReferenceParams::USE_BIAS) ? sampleParams.bias : 0.0f);

	int											numFailed			= 0;

	const tcu::Vec2 lodOffsets[] =
	{
		tcu::Vec2(-1,  0),
		tcu::Vec2(+1,  0),
		tcu::Vec2( 0, -1),
		tcu::Vec2( 0, +1),
	};

	tcu::clear(errorMask, tcu::RGBA::green().toVec());

	for (int py = 0; py < result.getHeight(); py++)
	{
		// Ugly hack, validation can take way too long at the moment.
		if (watchDog)
			qpWatchDog_touch(watchDog);

		for (int px = 0; px < result.getWidth(); px++)
		{
			const tcu::Vec4	resPix	= (result.getPixel(px, py)		- sampleParams.colorBias) / sampleParams.colorScale;
			const tcu::Vec4	refPix	= (reference.getPixel(px, py)	- sampleParams.colorBias) / sampleParams.colorScale;

			// Try comparison to ideal reference first, and if that fails use slower verificator.
			if (!tcu::boolAll(tcu::lessThanEqual(tcu::abs(resPix - refPix), lookupPrec.colorThreshold)))
			{
				const float		wx		= (float)px + 0.5f;
				const float		wy		= (float)py + 0.5f;
				const float		nx		= wx / dstW;
				const float		ny		= wy / dstH;

				const int		triNdx	= nx + ny >= 1.0f ? 1 : 0;
				const float		triWx	= triNdx ? dstW - wx : wx;
				const float		triWy	= triNdx ? dstH - wy : wy;
				const float		triNx	= triNdx ? 1.0f - nx : nx;
				const float		triNy	= triNdx ? 1.0f - ny : ny;

				const float		coord		= projectedTriInterpolate(triS[triNdx], triW[triNdx], triNx, triNy);
				const float		coordDx		= triDerivateX(triS[triNdx], triW[triNdx], wx, dstW, triNy) * float(srcSize);
				const float		coordDy		= triDerivateY(triS[triNdx], triW[triNdx], wy, dstH, triNx) * float(srcSize);

				tcu::Vec2		lodBounds	= tcu::computeLodBoundsFromDerivates(coordDx, coordDy, lodPrec);

				// Compute lod bounds across lodOffsets range.
				for (int lodOffsNdx = 0; lodOffsNdx < DE_LENGTH_OF_ARRAY(lodOffsets); lodOffsNdx++)
				{
					const float		wxo		= triWx + lodOffsets[lodOffsNdx].x();
					const float		wyo		= triWy + lodOffsets[lodOffsNdx].y();
					const float		nxo		= wxo/dstW;
					const float		nyo		= wyo/dstH;

					const float	coordDxo	= triDerivateX(triS[triNdx], triW[triNdx], wxo, dstW, nyo) * float(srcSize);
					const float	coordDyo	= triDerivateY(triS[triNdx], triW[triNdx], wyo, dstH, nxo) * float(srcSize);
					const tcu::Vec2	lodO	= tcu::computeLodBoundsFromDerivates(coordDxo, coordDyo, lodPrec);

					lodBounds.x() = de::min(lodBounds.x(), lodO.x());
					lodBounds.y() = de::max(lodBounds.y(), lodO.y());
				}

				const tcu::Vec2	clampedLod	= tcu::clampLodBounds(lodBounds + lodBias, tcu::Vec2(sampleParams.minLod, sampleParams.maxLod), lodPrec);
				const bool		isOk		= tcu::isLookupResultValid(src, sampleParams.sampler, lookupPrec, coord, clampedLod, resPix);

				if (!isOk)
				{
					errorMask.setPixel(tcu::RGBA::red().toVec(), px, py);
					numFailed += 1;
				}
			}
		}
	}

	return numFailed;
}